

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O1

bool __thiscall xLearn::Checker::check_train_param(Checker *this,HyperParam *hyper_param)

{
  string *psVar1;
  string *psVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  _Alloc_hider this_00;
  Modifier reset;
  Modifier bold;
  Modifier red;
  Modifier local_54;
  Modifier local_50;
  Modifier local_4c;
  string local_48;
  
  if (hyper_param->from_file == true) {
    bVar5 = FileExist((hyper_param->train_set_file)._M_dataplus._M_p);
    bVar4 = true;
    if (!bVar5) {
      StringPrintf_abi_cxx11_
                (&local_48,"Training data file: %s does not exist.",
                 (hyper_param->train_set_file)._M_dataplus._M_p);
      local_4c.code = FG_RED;
      local_50.code = BOLD;
      local_54.code = RESET;
      poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
      poVar7 = Color::operator<<(poVar7,&local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
      poVar7 = Color::operator<<(poVar7,&local_54);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      bVar4 = false;
    }
    if ((hyper_param->validate_set_file)._M_string_length == 0) goto LAB_001520a4;
    bVar5 = FileExist((hyper_param->validate_set_file)._M_dataplus._M_p);
    if (bVar5) goto LAB_001520a4;
    StringPrintf_abi_cxx11_
              (&local_48,"Validation data file: %s does not exist.",
               (hyper_param->validate_set_file)._M_dataplus._M_p);
    local_4c.code = FG_RED;
    local_50.code = BOLD;
    local_54.code = RESET;
    poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
    poVar7 = Color::operator<<(poVar7,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
    poVar7 = Color::operator<<(poVar7,&local_54);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  else {
    bVar4 = true;
    if (hyper_param->train_dataset != (DMatrix *)0x0) goto LAB_001520a4;
    StringPrintf_abi_cxx11_(&local_48,"Training dataset is None, please check!");
    local_4c.code = FG_RED;
    local_50.code = BOLD;
    local_54.code = RESET;
    poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
    poVar7 = Color::operator<<(poVar7,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
    poVar7 = Color::operator<<(poVar7,&local_54);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  bVar4 = false;
LAB_001520a4:
  if (hyper_param->thread_number < 0) {
    StringPrintf_abi_cxx11_(&local_48,"The thread number must be greater than zero: %d.");
    local_4c.code = FG_RED;
    local_50.code = BOLD;
    local_54.code = RESET;
    poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
    poVar7 = Color::operator<<(poVar7,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
    poVar7 = Color::operator<<(poVar7,&local_54);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    bVar4 = false;
  }
  iVar6 = std::__cxx11::string::compare((char *)&hyper_param->loss_func);
  if (iVar6 == 0) {
    StringPrintf_abi_cxx11_(&local_48,"The task can only be \'binary\' or \'reg\'.");
    local_4c.code = FG_RED;
    local_50.code = BOLD;
    local_54.code = RESET;
    poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
    poVar7 = Color::operator<<(poVar7,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
    poVar7 = Color::operator<<(poVar7,&local_54);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    bVar4 = false;
  }
  psVar1 = &hyper_param->metric;
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar6 != 0) {
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar6 != 0) {
                  iVar6 = std::__cxx11::string::compare((char *)psVar1);
                  if (iVar6 != 0) {
                    iVar6 = std::__cxx11::string::compare((char *)psVar1);
                    if (iVar6 != 0) {
                      StringPrintf_abi_cxx11_
                                (&local_48,"Unknow evaluation metric: %s.",
                                 (psVar1->_M_dataplus)._M_p);
                      Color::print_error(&local_48);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_48._M_dataplus._M_p != &local_48.field_2) {
                        operator_delete(local_48._M_dataplus._M_p);
                      }
                      bVar4 = false;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  psVar2 = &hyper_param->opt_type;
  this_00._M_p = (pointer)psVar2;
  iVar6 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar6 != 0) {
    this_00._M_p = (pointer)psVar2;
    iVar6 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar6 != 0) {
      this_00._M_p = (pointer)psVar2;
      iVar6 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar6 != 0) {
        StringPrintf_abi_cxx11_
                  (&local_48,"Unknow optimization method: %s.",(psVar2->_M_dataplus)._M_p);
        local_4c.code = FG_RED;
        local_50.code = BOLD;
        local_54.code = RESET;
        poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
        poVar7 = Color::operator<<(poVar7,&local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
        poVar7 = Color::operator<<(poVar7,&local_54);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        this_00._M_p = local_48._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        bVar4 = false;
      }
    }
  }
  if (999999 < hyper_param->num_K) {
    StringPrintf_abi_cxx11_(&local_48,"Invalid size of K: %d. Size of K must be greater than zero.")
    ;
    local_4c.code = FG_RED;
    local_50.code = BOLD;
    local_54.code = RESET;
    poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
    poVar7 = Color::operator<<(poVar7,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
    poVar7 = Color::operator<<(poVar7,&local_54);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    this_00._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    bVar4 = false;
  }
  if (hyper_param->num_folds < 1) {
    StringPrintf_abi_cxx11_
              (&local_48,"Invalid size of folds: %d. Size of folds must be greater than zero.");
    local_4c.code = FG_RED;
    local_50.code = BOLD;
    local_54.code = RESET;
    poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
    poVar7 = Color::operator<<(poVar7,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
    poVar7 = Color::operator<<(poVar7,&local_54);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    this_00._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    bVar4 = false;
  }
  if (hyper_param->num_epoch < 1) {
    StringPrintf_abi_cxx11_
              (&local_48,"Invalid number of epoch: %d. Number of epoch must be greater than zero.");
    local_4c.code = FG_RED;
    local_50.code = BOLD;
    local_54.code = RESET;
    poVar7 = Color::operator<<((ostream *)&std::cout,&local_4c);
    poVar7 = Color::operator<<(poVar7,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ERROR      ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_48._M_dataplus._M_p,local_48._M_string_length);
    poVar7 = Color::operator<<(poVar7,&local_54);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    this_00._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    bVar4 = false;
  }
  if (bVar4) {
    check_conflict_train((Checker *)this_00._M_p,hyper_param);
    if (((hyper_param->model_file)._M_string_length == 0) &&
       (hyper_param->cross_validation == false)) {
      pcVar3 = (hyper_param->train_set_file)._M_dataplus._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar3,pcVar3 + (hyper_param->train_set_file)._M_string_length)
      ;
      std::__cxx11::string::append((char *)&local_48);
      std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(hyper_param->metric)._M_string_length,0x1640af);
    }
  }
  return bVar4;
}

Assistant:

bool Checker::check_train_param(HyperParam& hyper_param) {
  bool bo = true;
  /*********************************************************
   *  Check file path                                      *
   *********************************************************/
  if (hyper_param.from_file) {
    if (!FileExist(hyper_param.train_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Training data file: %s does not exist.", 
                      hyper_param.train_set_file.c_str())
      );
      bo = false;
    }
    if (!hyper_param.validate_set_file.empty() &&
        !FileExist(hyper_param.validate_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Validation data file: %s does not exist.", 
                      hyper_param.validate_set_file.c_str())
      );
      bo = false;
    }  
  } else {
    if (hyper_param.train_dataset == nullptr) {
      Color::print_error(
        StringPrintf("Training dataset is None, please check!")
      );
      bo = false;
    }
  }
  /*********************************************************
   *  Check invalid value                                  *
   *********************************************************/
  if (hyper_param.thread_number < 0) {
    Color::print_error(
      StringPrintf("The thread number must be greater than zero: %d.",
        hyper_param.thread_number)
    );
    bo = false;
  }
  if (hyper_param.loss_func.compare("unknow") == 0) {
    Color::print_error(
      StringPrintf("The task can only be 'binary' or 'reg'.")
    );
    bo = false;
  }
  if (hyper_param.metric.compare("acc") != 0 &&
      hyper_param.metric.compare("prec") != 0 &&
      hyper_param.metric.compare("recall") != 0 &&
      hyper_param.metric.compare("f1") != 0 &&
      hyper_param.metric.compare("auc") != 0 &&
      hyper_param.metric.compare("mae") != 0 &&
      hyper_param.metric.compare("mape") != 0 &&
      hyper_param.metric.compare("rmsd") != 0 &&
      hyper_param.metric.compare("rmse") != 0 &&
      hyper_param.metric.compare("none") != 0) {
    Color::print_error(
      StringPrintf("Unknow evaluation metric: %s.",
        hyper_param.metric.c_str())
    );
    bo = false;
  }
  if (hyper_param.opt_type.compare("sgd") != 0 &&
      hyper_param.opt_type.compare("ftrl") != 0 &&
      hyper_param.opt_type.compare("adagrad") != 0) {
    Color::print_error(
      StringPrintf("Unknow optimization method: %s.",
        hyper_param.opt_type.c_str())
    );
    bo = false;
  }
  if (hyper_param.num_K > 999999) {
    Color::print_error(
      StringPrintf("Invalid size of K: %d. "
                   "Size of K must be greater than zero.", 
        hyper_param.num_K)
    );
    bo = false;
  }
  if (hyper_param.num_folds <= 0) {
    Color::print_error(
      StringPrintf("Invalid size of folds: %d. "
                   "Size of folds must be greater than zero.", 
        hyper_param.num_folds)
    );
    bo = false;
  }
  if (hyper_param.num_epoch <= 0) {
    Color::print_error(
      StringPrintf("Invalid number of epoch: %d. "
                   "Number of epoch must be greater than zero.", 
        hyper_param.num_epoch)
    );
    bo = false;
  }
  if (!bo) return false;
  /*********************************************************
   *  Check warning and fix conflict                       *
   *********************************************************/
  check_conflict_train(hyper_param);
  /*********************************************************
   *  Set default value                                    *
   *********************************************************/
  if (hyper_param.model_file.empty() && !hyper_param.cross_validation) {
    hyper_param.model_file = hyper_param.train_set_file + ".model";
  }
  if (hyper_param.metric.compare("rmse") == 0) {
    hyper_param.metric = "rmsd";
  }

  return true;
}